

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::isNameAndEquals(QPDFObjectHandle *this,string *name)

{
  bool bVar1;
  __type_conflict2 local_42;
  string local_40;
  string *local_20;
  string *name_local;
  QPDFObjectHandle *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  bVar1 = isName(this);
  local_42 = false;
  if (bVar1) {
    getName_abi_cxx11_(&local_40,this);
    local_42 = std::operator==(&local_40,local_20);
  }
  this_local._7_1_ = local_42;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
QPDFObjectHandle::isNameAndEquals(std::string const& name) const
{
    return isName() && (getName() == name);
}